

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

arg_end * arg_end(int maxcount)

{
  arg_end *paVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (long)maxcount;
  paVar1 = (arg_end *)malloc(lVar3 * 0x14 + 0x80);
  if (paVar1 != (arg_end *)0x0) {
    (paVar1->hdr).flag = '\x01';
    (paVar1->hdr).shortopts = (char *)0x0;
    (paVar1->hdr).longopts = (char *)0x0;
    (paVar1->hdr).datatype = (char *)0x0;
    (paVar1->hdr).glossary = (char *)0x0;
    (paVar1->hdr).mincount = 1;
    (paVar1->hdr).maxcount = maxcount;
    (paVar1->hdr).parent = paVar1;
    (paVar1->hdr).resetfn = arg_end_resetfn;
    (paVar1->hdr).scanfn = (arg_scanfn *)0x0;
    (paVar1->hdr).checkfn = (arg_checkfn *)0x0;
    (paVar1->hdr).errorfn = arg_end_errorfn;
    paVar1->error = (int *)(paVar1 + 1);
    pcVar2 = &paVar1[1].hdr.flag + lVar3 * 4;
    paVar1->parent = (void **)pcVar2;
    paVar1->argval = (char **)(pcVar2 + lVar3 * 8);
  }
  return paVar1;
}

Assistant:

struct arg_end * arg_end(int maxcount) {
	size_t nbytes;
	struct arg_end * result;

	nbytes = sizeof(struct arg_end)
			 + maxcount * sizeof(int)     /* storage for int error[maxcount] array*/
			 + maxcount * sizeof(void *)  /* storage for void* parent[maxcount] array */
			 + maxcount * sizeof(char *); /* storage for char* argval[maxcount] array */

	result = (struct arg_end *)malloc(nbytes);

	if (result) {
		/* init the arg_hdr struct */
		result->hdr.flag      = ARG_TERMINATOR;
		result->hdr.shortopts = NULL;
		result->hdr.longopts  = NULL;
		result->hdr.datatype  = NULL;
		result->hdr.glossary  = NULL;
		result->hdr.mincount  = 1;
		result->hdr.maxcount  = maxcount;
		result->hdr.parent    = result;
		result->hdr.resetfn   = (arg_resetfn *)arg_end_resetfn;
		result->hdr.scanfn    = NULL;
		result->hdr.checkfn   = NULL;
		result->hdr.errorfn   = (arg_errorfn *)arg_end_errorfn;

		/* store error[maxcount] array immediately after struct arg_end */
		result->error = (int *)(result + 1);

		/* store parent[maxcount] array immediately after error[] array */
		result->parent = (void * *)(result->error + maxcount );

		/* store argval[maxcount] array immediately after parent[] array */
		result->argval = (const char * *)(result->parent + maxcount );
	}

	ARG_TRACE(("arg_end(%d) returns %p\n", maxcount, result));
	return result;
}